

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkToBarBufsCollect(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  long *plVar4;
  long lVar5;
  void *pvVar6;
  long *plVar7;
  Vec_Ptr_t *vNodes;
  void **ppvVar8;
  int *piVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar12;
  int extraout_EDX_02;
  int Fill;
  int Fill_00;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int iVar13;
  uint uVar14;
  long lVar15;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x165,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs < 1) {
    __assert_fail("pNtk->nBarBufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x166,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs != pNtk->nObjCounts[8]) {
    __assert_fail("pNtk->nBarBufs == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x167,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  iVar12 = pNtk->nObjs;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar13 = 8;
  if (6 < iVar12 - 1U) {
    iVar13 = iVar12;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar13;
  if (iVar13 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar13 << 3);
  }
  vNodes->pArray = ppvVar8;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar12 = pNtk->vObjs->nSize;
    uVar11 = (long)iVar12 + 500;
    iVar13 = (int)uVar11;
    if ((pNtk->vTravIds).nCap < iVar13) {
      piVar9 = (int *)malloc(uVar11 * 4);
      (pNtk->vTravIds).pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar13;
    }
    if (-500 < iVar12) {
      memset((pNtk->vTravIds).pArray,0,(uVar11 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar13;
  }
  iVar12 = pNtk->nTravIds;
  pNtk->nTravIds = iVar12 + 1;
  if (0x3ffffffe < iVar12) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar10 = pNtk->vCis;
  uVar11 = (ulong)(uint)pVVar10->nSize;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      iVar12 = pNtk->nBarBufs;
      if ((long)(int)uVar11 - (long)iVar12 <= lVar15) break;
      plVar4 = (long *)pVVar10->pArray[lVar15];
      uVar1 = vNodes->nSize;
      uVar2 = vNodes->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
            iVar12 = extraout_EDX_01;
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,0x80);
            iVar12 = extraout_EDX;
          }
          iVar13 = 0x10;
        }
        else {
          iVar13 = uVar2 * 2;
          if (iVar13 <= (int)uVar2) goto LAB_0084424b;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
            iVar12 = extraout_EDX_02;
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
            iVar12 = extraout_EDX_00;
          }
        }
        vNodes->pArray = ppvVar8;
        vNodes->nCap = iVar13;
      }
LAB_0084424b:
      vNodes->nSize = uVar1 + 1;
      vNodes->pArray[(int)uVar1] = plVar4;
      lVar5 = *plVar4;
      uVar3 = *(undefined4 *)(lVar5 + 0xd8);
      iVar13 = (int)plVar4[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar13 + 1,iVar12);
      if (((long)iVar13 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar13)) goto LAB_0084472e;
      *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar13 * 4) = uVar3;
      lVar15 = lVar15 + 1;
      pVVar10 = pNtk->vCis;
      uVar11 = (ulong)pVVar10->nSize;
    } while (lVar15 < (long)uVar11);
  }
  pVVar10 = pNtk->vCos;
  uVar11 = (ulong)(uint)pVVar10->nSize;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      if ((long)(int)uVar11 - (long)pNtk->nBarBufs <= lVar15) {
        plVar4 = (long *)pVVar10->pArray[lVar15];
        Abc_NtkToBarBufsCollect_rec
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8),vNodes)
        ;
        uVar1 = vNodes->nSize;
        uVar2 = vNodes->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(vNodes->pArray,0x80);
            }
            iVar12 = 0x10;
          }
          else {
            iVar12 = uVar2 * 2;
            if (iVar12 <= (int)uVar2) goto LAB_00844374;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
            }
          }
          vNodes->pArray = ppvVar8;
          vNodes->nCap = iVar12;
        }
LAB_00844374:
        ppvVar8 = vNodes->pArray;
        vNodes->nSize = uVar1 + 1;
        ppvVar8[(int)uVar1] = plVar4;
        pvVar6 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
        uVar2 = vNodes->nCap;
        if (uVar1 + 1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,0x80);
            }
            iVar12 = 0x10;
          }
          else {
            iVar12 = uVar2 * 2;
            if (iVar12 <= (int)uVar2) goto LAB_008443ef;
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar2 << 4);
            }
          }
          vNodes->pArray = ppvVar8;
          vNodes->nCap = iVar12;
        }
LAB_008443ef:
        ppvVar8 = vNodes->pArray;
        uVar14 = uVar1 + 2;
        vNodes->nSize = uVar14;
        ppvVar8[(long)(int)uVar1 + 1] = pvVar6;
        plVar7 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
        pvVar6 = *(void **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[6] * 8);
        uVar2 = vNodes->nCap;
        if (uVar14 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,0x80);
            }
            iVar12 = 0x10;
          }
          else {
            iVar12 = uVar2 * 2;
            if (iVar12 <= (int)uVar2) goto LAB_00844490;
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar2 << 4);
            }
          }
          vNodes->pArray = ppvVar8;
          vNodes->nCap = iVar12;
        }
LAB_00844490:
        vNodes->nSize = uVar1 + 3;
        vNodes->pArray[(int)uVar14] = pvVar6;
        lVar5 = *plVar4;
        uVar3 = *(undefined4 *)(lVar5 + 0xd8);
        iVar12 = (int)plVar4[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar12 + 1,(int)pvVar6);
        if (((long)iVar12 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar12)) goto LAB_0084472e;
        *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar12 * 4) = uVar3;
        plVar7 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
        lVar5 = *plVar7;
        uVar3 = *(undefined4 *)(lVar5 + 0xd8);
        iVar12 = (int)plVar7[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar12 + 1,Fill);
        if (((long)iVar12 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar12)) goto LAB_0084472e;
        *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar12 * 4) = uVar3;
        plVar4 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
        plVar4 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
        lVar5 = *plVar4;
        uVar3 = *(undefined4 *)(lVar5 + 0xd8);
        iVar12 = (int)plVar4[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar12 + 1,Fill_00);
        if (((long)iVar12 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar12)) goto LAB_0084472e;
        *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar12 * 4) = uVar3;
      }
      lVar15 = lVar15 + 1;
      pVVar10 = pNtk->vCos;
      uVar11 = (ulong)pVVar10->nSize;
    } while (lVar15 < (long)uVar11);
  }
  pVVar10 = pNtk->vCos;
  uVar11 = (ulong)(uint)pVVar10->nSize;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      if ((long)(int)uVar11 - (long)pNtk->nBarBufs <= lVar15) break;
      plVar4 = (long *)pVVar10->pArray[lVar15];
      Abc_NtkToBarBufsCollect_rec
                (*(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8),vNodes);
      uVar1 = vNodes->nSize;
      uVar2 = vNodes->nCap;
      iVar12 = extraout_EDX_03;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
            iVar12 = extraout_EDX_06;
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,0x80);
            iVar12 = extraout_EDX_04;
          }
          iVar13 = 0x10;
        }
        else {
          iVar13 = uVar2 * 2;
          if (iVar13 <= (int)uVar2) goto LAB_0084469b;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
            iVar12 = extraout_EDX_07;
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
            iVar12 = extraout_EDX_05;
          }
        }
        vNodes->pArray = ppvVar8;
        vNodes->nCap = iVar13;
      }
LAB_0084469b:
      vNodes->nSize = uVar1 + 1;
      vNodes->pArray[(int)uVar1] = plVar4;
      lVar5 = *plVar4;
      uVar3 = *(undefined4 *)(lVar5 + 0xd8);
      iVar13 = (int)plVar4[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar13 + 1,iVar12);
      if (((long)iVar13 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar13)) {
LAB_0084472e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar13 * 4) = uVar3;
      lVar15 = lVar15 + 1;
      pVVar10 = pNtk->vCos;
      uVar11 = (ulong)pVVar10->nSize;
    } while (lVar15 < (long)uVar11);
  }
  if (vNodes->nSize != pNtk->nObjs) {
    __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkObjNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x185,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkToBarBufsCollect( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtk->nBarBufs > 0 );
    assert( pNtk->nBarBufs == Abc_NtkLatchNum(pNtk) );
    vNodes = Vec_PtrAlloc( Abc_NtkObjNum(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        Vec_PtrPush( vNodes, pObj );
        Abc_NodeSetTravIdCurrent( pObj );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( i < Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            continue;
        Abc_NtkToBarBufsCollect_rec( Abc_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(pObj) );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(Abc_ObjFanout0(pObj)) );
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pObj) );
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(Abc_ObjFanout0(pObj)) );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Abc_NtkToBarBufsCollect_rec( Abc_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        Abc_NodeSetTravIdCurrent( pObj );
    }
    assert( Vec_PtrSize(vNodes) == Abc_NtkObjNum(pNtk) );
    return vNodes;
}